

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool libtorrent::aux::anon_unknown_135::trigger_announce
               (session_interface *ses,bool is_ssl,bool complete_sent,reannounce_flags_t flags,
               time_point t,announce_entry *e)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  *__lhs;
  int local_98;
  duration<int,_std::ratio<1L,_1L>_> local_94;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_90;
  int local_8c;
  duration<int,_std::ratio<1L,_1L>_> local_88;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_84;
  uchar local_7f;
  uchar local_7e;
  bitfield_flag local_7d;
  duration local_7c;
  iterator local_78;
  value_type *a;
  iterator __end3;
  iterator __begin3;
  array<announce_infohash,_num_protocols,_protocol_version>_conflict *__range3;
  announce_endpoint *aep;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *__range2;
  bool ret;
  announce_entry *e_local;
  bool complete_sent_local;
  bool is_ssl_local;
  session_interface *ses_local;
  time_point t_local;
  reannounce_flags_t flags_local;
  
  __range2._7_1_ = false;
  ses_local = (session_interface *)t.__d.__r;
  t_local.__d.__r._7_1_ = flags.m_val;
  refresh_endpoint_list(ses,is_ssl,complete_sent,e);
  __end2 = ::std::
           vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ::begin(&e->endpoints);
  aep = (announce_endpoint *)
        ::std::
        vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
        ::end(&e->endpoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                                *)&aep);
    if (!bVar1) break;
    __range3 = (array<announce_infohash,_num_protocols,_protocol_version>_conflict *)
               __gnu_cxx::
               __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
               ::operator*(&__end2);
    __begin3 = (iterator)&((reference)__range3)->info_hashes;
    __end3 = ::std::array<libtorrent::aux::announce_infohash,_2UL>::begin
                       ((array<libtorrent::aux::announce_infohash,_2UL> *)__begin3);
    a = ::std::array<libtorrent::aux::announce_infohash,_2UL>::end
                  ((array<libtorrent::aux::announce_infohash,_2UL> *)__begin3);
    for (; __end3 != a; __end3 = __end3 + 1) {
      local_78 = __end3;
      local_7e = t_local.__d.__r._7_1_;
      local_7f = '\x01';
      local_7d = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::reannounce_flags_tag,_void>)
                            t_local.__d.__r._7_1_,
                            (bitfield_flag<unsigned_char,_libtorrent::reannounce_flags_tag,_void>)
                            '\x01');
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_7d);
      if (bVar1) {
        local_84.__d.__r =
             (duration)
             ::std::chrono::
             time_point_cast<std::chrono::duration<int,std::ratio<1l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&ses_local);
        local_8c = 1;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_88,&local_8c);
        local_7c.__r = (rep_conflict)::std::chrono::operator+(&local_84,&local_88);
      }
      else {
        local_90.__d.__r =
             (duration)
             ::std::chrono::
             time_point_cast<std::chrono::duration<int,std::ratio<1l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&ses_local);
        __lhs = ::std::
                max<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>>
                          (&local_90,&local_78->min_announce);
        local_98 = 1;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_94,&local_98);
        local_7c.__r = (rep_conflict)::std::chrono::operator+(__lhs,&local_94);
      }
      (local_78->next_announce).__d.__r = local_7c.__r;
      (local_78->min_announce).__d.__r = (local_78->next_announce).__d.__r;
      *(ushort *)&local_78->field_0x44 = *(ushort *)&local_78->field_0x44 & 0xfbff | 0x400;
      __range2._7_1_ = true;
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
    ::operator++(&__end2);
  }
  return __range2._7_1_;
}

Assistant:

bool trigger_announce(aux::session_interface& ses
		, bool const is_ssl
		, bool const complete_sent
		, reannounce_flags_t const flags
		, time_point const t
		, aux::announce_entry& e)
	{
		bool ret = false;
		// make sure we check for new endpoints from the listen sockets
		refresh_endpoint_list(ses, is_ssl, complete_sent, e);
		for (auto& aep : e.endpoints)
		{
			for (auto& a : aep.info_hashes)
			{
				a.next_announce = (flags & torrent_handle::ignore_min_interval)
					? time_point_cast<seconds32>(t) + seconds32(1)
					: std::max(time_point_cast<seconds32>(t), a.min_announce) + seconds32(1);
				a.min_announce = a.next_announce;
				a.triggered_manually = true;
				ret = true;
			}
		}
		return ret;
	}